

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_allocator.h
# Opt level: O2

pointer __thiscall
util::AlignedAllocator<math::Vector<float,_64>,_16UL>::allocate
          (AlignedAllocator<math::Vector<float,_64>,_16UL> *this,size_type n)

{
  int iVar1;
  undefined8 *puVar2;
  pointer local_10;
  pointer p;
  
  if (n >> 0x38 == 0) {
    local_10 = (pointer)0x0;
    iVar1 = posix_memalign(&local_10,0x10,n << 8);
    if (iVar1 == 0) {
      return local_10;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = operator_delete;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

inline typename AlignedAllocator<T, alignment>::pointer
AlignedAllocator<T, alignment>::allocate (size_type n)
{
    if (n > this->max_size())
      throw std::bad_alloc();
    size_t size = n * sizeof(T);
    pointer p = nullptr;
#ifdef _WIN32
    p = reinterpret_cast<pointer>(::_aligned_malloc(size, alignment));
    if (p == nullptr)
        throw std::bad_alloc();
#else
    if (::posix_memalign(&reinterpret_cast<void*&>(p), alignment, size))
        throw std::bad_alloc();
#endif
    return p;
}